

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O2

bool __thiscall jhu::thrax::AlignedSentencePair::consistent(AlignedSentencePair *this)

{
  bool bVar1;
  
  bVar1 = std::
          all_of<__gnu_cxx::__normal_iterator<jhu::thrax::Point_const*,std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>>,jhu::thrax::AlignedSentencePair::consistent()const::_lambda(auto:1)_1_>
                    ((this->alignment).
                     super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (this->alignment).
                     super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_8991fb9c)this);
  return bVar1;
}

Assistant:

bool consistent() const {
    return std::all_of(
        alignment.begin(),
        alignment.end(),
        [this](auto p) {
          return p.src >= 0
              && p.tgt >= 0
              && p.src < static_cast<IndexType>(src.size())
              && p.tgt < static_cast<IndexType>(tgt.size());
        });
  }